

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

void __thiscall tf::Executor::_tear_down_topology(Executor *this,Worker *worker,Topology *tpg)

{
  size_t *psVar1;
  Taskflow *pTVar2;
  _Map_pointer ppsVar3;
  Topology *tpg_00;
  _Manager_type p_Var4;
  iterator __position;
  bool bVar5;
  int iVar6;
  type c;
  unique_lock<std::mutex> lock;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  unique_lock<std::mutex> local_58;
  promise<void> local_48;
  
  pTVar2 = tpg->_taskflow;
  if (((tpg->super_TopologyBase)._is_cancelled._M_base._M_i & 1U) == 0) {
    if ((tpg->_pred).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar5 = (*(tpg->_pred)._M_invoker)((_Any_data *)&tpg->_pred);
    if (!bVar5) {
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)&pTVar2->_mutex);
      if (iVar6 == 0) {
        LOCK();
        (tpg->_join_counter).super___atomic_base<unsigned_long>._M_i =
             (long)(tpg->_sources).super_SmallVectorImpl<tf::Node_*>.
                   super_SmallVectorTemplateBase<tf::Node_*,_true>.
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
             (long)(tpg->_sources).super_SmallVectorImpl<tf::Node_*>.
                   super_SmallVectorTemplateBase<tf::Node_*,_true>.
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX >>
             3;
        UNLOCK();
        _schedule(this,worker,&tpg->_sources);
        pthread_mutex_unlock((pthread_mutex_t *)&pTVar2->_mutex);
        return;
      }
      std::__throw_system_error(iVar6);
    }
  }
  if ((tpg->_call).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(tpg->_call)._M_invoker)((_Any_data *)&tpg->_call);
  }
  local_58._M_device = &pTVar2->_mutex;
  local_58._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_58);
  local_58._M_owns = true;
  ppsVar3 = (pTVar2->_topologies).c.
            super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(pTVar2->_topologies).c.
             super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(pTVar2->_topologies).c.
             super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
      ((long)(pTVar2->_topologies).c.
             super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(pTVar2->_topologies).c.
             super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      ((((ulong)((long)ppsVar3 -
                (long)(pTVar2->_topologies).c.
                      super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppsVar3 == (_Map_pointer)0x0)) * 0x20 < 2) {
    local_48._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (tpg->_promise)._M_future.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (tpg->_promise)._M_future.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    (tpg->_promise)._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (tpg->_promise)._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter,_true,_true>
          )(tpg->_promise)._M_storage._M_t.
           super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
           .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl;
    (tpg->_promise)._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
         (_Result<void> *)0x0;
    local_68 = (_Manager_type)0x0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = (tpg->_call)._M_invoker;
    p_Var4 = (tpg->_call).super__Function_base._M_manager;
    if (p_Var4 != (_Manager_type)0x0) {
      local_78._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(tpg->_call).super__Function_base._M_functor;
      local_78._8_8_ = *(undefined8 *)((long)&(tpg->_call).super__Function_base._M_functor + 8);
      (tpg->_call).super__Function_base._M_manager = (_Manager_type)0x0;
      (tpg->_call)._M_invoker = (_Invoker_type)0x0;
      local_68 = p_Var4;
    }
    __position._M_node =
         (pTVar2->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>.
         _M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_payload.
         _M_value._M_node;
    bVar5 = (pTVar2->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>
            ._M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged;
    std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
    pop_front(&(pTVar2->_topologies).c);
    std::unique_lock<std::mutex>::unlock(&local_58);
    std::promise<void>::set_value(&local_48);
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->_topology_mutex);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    psVar1 = &this->_num_topologies;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      std::condition_variable::notify_all();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_topology_mutex);
    if ((bVar5 & 1U) != 0) {
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->_taskflow_mutex);
      if (iVar6 != 0) {
        std::__throw_system_error(iVar6);
      }
      std::__cxx11::list<tf::Taskflow,_std::allocator<tf::Taskflow>_>::_M_erase
                (&this->_taskflows,__position);
      pthread_mutex_unlock((pthread_mutex_t *)&this->_taskflow_mutex);
    }
    if (local_68 != (_Manager_type)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    std::promise<void>::~promise(&local_48);
  }
  else {
    std::promise<void>::set_value(&tpg->_promise);
    std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
    pop_front(&(pTVar2->_topologies).c);
    tpg_00 = (((pTVar2->_topologies).c.
               super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->_topology_mutex);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    this->_num_topologies = this->_num_topologies - 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->_topology_mutex);
    _set_up_topology(this,worker,tpg_00);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_58);
  return;
}

Assistant:

inline void Executor::_tear_down_topology(Worker& worker, Topology* tpg) {

  auto &f = tpg->_taskflow;

  //assert(&tpg == &(f._topologies.front()));

  // case 1: we still need to run the topology again
  if(!tpg->_is_cancelled && !tpg->_pred()) {
    //assert(tpg->_join_counter == 0);
    std::lock_guard<std::mutex> lock(f._mutex);
    tpg->_join_counter = tpg->_sources.size();
    _schedule(worker, tpg->_sources);
  }
  // case 2: the final run of this topology
  else {

    // TODO: if the topology is cancelled, need to release all semaphores

    if(tpg->_call != nullptr) {
      tpg->_call();
    }

    // If there is another run (interleave between lock)
    if(std::unique_lock<std::mutex> lock(f._mutex); f._topologies.size()>1) {
      //assert(tpg->_join_counter == 0);

      // Set the promise
      tpg->_promise.set_value();
      f._topologies.pop();
      tpg = f._topologies.front().get();

      // decrement the topology but since this is not the last we don't notify
      _decrement_topology();

      // set up topology needs to be under the lock or it can
      // introduce memory order error with pop
      _set_up_topology(&worker, tpg);
    }
    else {
      //assert(f._topologies.size() == 1);

      // Need to back up the promise first here becuz taskflow might be
      // destroy soon after calling get
      auto p {std::move(tpg->_promise)};

      // Back up lambda capture in case it has the topology pointer,
      // to avoid it releasing on pop_front ahead of _mutex.unlock &
      // _promise.set_value. Released safely when leaving scope.
      auto c {std::move(tpg->_call)};

      // Get the satellite if any
      auto s {f._satellite};

      // Now we remove the topology from this taskflow
      f._topologies.pop();

      //f._mutex.unlock();
      lock.unlock();

      // We set the promise in the end in case taskflow leaves the scope.
      // After set_value, the caller will return from wait
      p.set_value();

      _decrement_topology_and_notify();

      // remove the taskflow if it is managed by the executor
      // TODO: in the future, we may need to synchronize on wait
      // (which means the following code should the moved before set_value)
      if(s) {
        std::scoped_lock<std::mutex> lock(_taskflow_mutex);
        _taskflows.erase(*s);
      }
    }
  }
}